

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall crnlib::dxt_hc::determine_color_endpoints(dxt_hc *this)

{
  long lVar1;
  float fVar2;
  ushort uVar3;
  uint uVar4;
  tile_details *ptVar5;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *__topIndex;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar6;
  task_pool *ptVar7;
  color_quad_u8 (*pacVar8) [16];
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar9;
  pointer __first;
  pointer pNVar10;
  bool bVar11;
  ulong uVar12;
  long lVar13;
  endpoint_indices_details *peVar14;
  uint uVar15;
  uint i;
  int iVar16;
  long lVar17;
  uint uVar18;
  uint p;
  code *pcVar19;
  _Iter_comp_val<std::less<Node>_> *in_R9;
  ulong uVar20;
  uint t;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar21;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar22;
  long lVar23;
  Node __value;
  vector<Node>_conflict nodes;
  uint local_1ac;
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> endpoints;
  vector<unsigned_int> weights;
  vector<crnlib::vec<6U,_float>_> vectors;
  priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> queue;
  color_quad_u8 mirror [16];
  tree_clusterizer<crnlib::vec<6U,_float>_> vq;
  
  uVar4 = this->m_pTask_pool->m_num_threads;
  endpoints.m_p = (pair<crnlib::vec<6U,_float>,_unsigned_int> *)0x0;
  endpoints.m_size = 0;
  endpoints.m_capacity = 0;
  lVar17 = 0x14;
  for (uVar20 = 0; uVar20 < (this->m_tiles).m_size; uVar20 = uVar20 + 1) {
    ptVar5 = (this->m_tiles).m_p;
    uVar15 = *(uint *)((long)(ptVar5->color_endpoint).m_s + lVar17 + -0x20);
    if (uVar15 != 0) {
      fVar2 = *(float *)((long)(&ptVar5->color_endpoint + -1) + lVar17);
      vec<6U,_float>::vec((vec<6U,_float> *)&vq,
                          (vec<6U,_float> *)((long)(ptVar5->color_endpoint).m_s + lVar17 + -0x14));
      vq.m_weightedDotProducts.m_p =
           (double *)CONCAT44(vq.m_weightedDotProducts.m_p._4_4_,(int)(long)((float)uVar15 * fVar2))
      ;
      vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::push_back
                (&endpoints,(pair<crnlib::vec<6U,_float>,_unsigned_int> *)&vq);
    }
    lVar17 = lVar17 + 0x48;
  }
  nodes.m_p = (Node *)0x0;
  nodes.m_size = 0;
  nodes.m_capacity = 0;
  pcVar19 = vector<Node>::object_mover;
  iVar16 = 0;
  ppVar21 = endpoints.m_p;
  do {
    uVar15 = (iVar16 + 1) * endpoints.m_size;
    do {
      ppVar22 = ppVar21;
      iVar16 = iVar16 + 1;
      if (uVar4 + 2 == iVar16) {
        lVar17 = 0;
        for (uVar20 = 0; uVar20 < nodes.m_size; uVar20 = uVar20 + 1) {
          task_pool::queue_task
                    (this->m_pTask_pool,determine_color_endpoints::Node::sort_task,uVar20,
                     (void *)((long)&(nodes.m_p)->p + lVar17));
          lVar17 = lVar17 + 0x10;
        }
        task_pool::join(this->m_pTask_pool);
        queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        lVar17 = 0;
        for (uVar20 = 0; uVar20 < nodes.m_size; uVar20 = uVar20 + 1) {
          std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::
          push(&queue,(value_type *)((long)&(nodes.m_p)->p + lVar17));
          lVar17 = lVar17 + 0x10;
        }
        vectors.m_p = (vec<6U,_float> *)0x0;
        vectors.m_size = 0;
        vectors.m_capacity = 0;
        weights.m_p = (uint *)0x0;
        weights.m_size = 0;
        weights.m_capacity = 0;
        vector<crnlib::vec<6U,_float>_>::reserve(&vectors,endpoints.m_size);
        vector<unsigned_int>::reserve(&weights,endpoints.m_size);
        while (pNVar10 = queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_finish,
              __first = queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                        super__Vector_impl_data._M_start,
              queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
              super__Vector_impl_data._M_start) {
          ppVar21 = (queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                     super__Vector_impl_data._M_start)->p;
          vq.m_weightedVectors.m_p =
               &(queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start)->pEnd->first;
          ppVar22 = ppVar21 + 1;
          vq.m_vectors = &ppVar22->first;
          if (0x10 < (long)queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                           super__Vector_impl_data._M_start) {
            __topIndex = queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_finish[-1].p;
            ppVar6 = queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].pEnd;
            ppVar9 = (queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                      super__Vector_impl_data._M_start)->pEnd;
            queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
            _M_finish[-1].p =
                 (queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_start)->p;
            queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
            _M_finish[-1].pEnd = ppVar9;
            uVar20 = (long)queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                           super__Vector_impl_data._M_finish +
                     (-0x10 - (long)queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            lVar13 = (long)uVar20 >> 4;
            lVar17 = 0;
            while (lVar17 < (lVar13 + -1) / 2) {
              lVar1 = lVar17 * 2 + 2;
              lVar23 = lVar17 * 2 + 1;
              bVar11 = std::operator<(__first[lVar23].p,__first[lVar1].p);
              if (!bVar11) {
                lVar23 = lVar1;
              }
              ppVar9 = __first[lVar23].pEnd;
              __first[lVar17].p = __first[lVar23].p;
              __first[lVar17].pEnd = ppVar9;
              lVar17 = lVar23;
            }
            if (((uVar20 & 0x10) == 0) && (lVar17 == lVar13 + -2 >> 1)) {
              lVar13 = lVar17 * 2 + 1;
              ppVar9 = __first[lVar13].pEnd;
              __first[lVar17].p = __first[lVar13].p;
              __first[lVar17].pEnd = ppVar9;
              lVar17 = lVar13;
            }
            __value.pEnd = (pair<crnlib::vec<6U,_float>,_unsigned_int> *)pcVar19;
            __value.p = ppVar6;
            std::
            __push_heap<__gnu_cxx::__normal_iterator<crnlib::dxt_hc::determine_color_endpoints()::Node*,std::vector<crnlib::dxt_hc::determine_color_endpoints()::Node,std::allocator<crnlib::dxt_hc::determine_color_endpoints()::Node>>>,long,crnlib::dxt_hc::determine_color_endpoints()::Node,__gnu_cxx::__ops::_Iter_comp_val<std::less<crnlib::dxt_hc::determine_color_endpoints()::Node>>>
                      ((__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>)__first
                       ,lVar17,(long)__topIndex,__value,in_R9);
          }
          queue.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
          _M_finish = pNVar10 + -1;
          if (ppVar22 != (pair<crnlib::vec<6U,_float>,_unsigned_int> *)vq.m_weightedVectors.m_p) {
            std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::
            push(&queue,(value_type *)&vq);
          }
          if ((vectors.m_size == 0) ||
             (bVar11 = helpers::operator!=(&ppVar21->first,vectors.m_p + (vectors.m_size - 1)),
             bVar11)) {
            vector<crnlib::vec<6U,_float>_>::push_back(&vectors,&ppVar21->first);
            vector<unsigned_int>::push_back(&weights,&ppVar21->second);
          }
          else {
            uVar15 = ppVar21->second + weights.m_p[weights.m_size - 1];
            if (CARRY4(ppVar21->second,weights.m_p[weights.m_size - 1])) {
              uVar15 = 0xffffffff;
            }
            weights.m_p[weights.m_size - 1] = uVar15;
          }
        }
        vq.m_node_index_map.m_values.m_p = (raw_node *)0x0;
        vq.m_node_index_map.m_values.m_size = 0;
        vq.m_node_index_map.m_values.m_capacity = 0;
        vq.m_vectorComparison.m_p = (bool *)0x0;
        vq.m_vectorComparison.m_size = 0;
        vq.m_vectorComparison.m_capacity = 0;
        vq.m_vectorsInfoRight.m_p = (VectorInfo *)0x0;
        vq.m_vectorsInfoRight.m_size = 0;
        vq.m_vectorsInfoRight.m_capacity = 0;
        vq.m_vectorsInfoLeft.m_p = (VectorInfo *)0x0;
        vq.m_vectorsInfoLeft.m_size = 0;
        vq.m_vectorsInfoLeft.m_capacity = 0;
        vq.m_vectorsInfo.m_p = (VectorInfo *)0x0;
        vq.m_vectorsInfo.m_size = 0;
        vq.m_vectorsInfo.m_capacity = 0;
        vq.m_weightedDotProducts.m_p = (double *)0x0;
        vq.m_weightedDotProducts.m_size = 0;
        vq.m_weightedDotProducts.m_capacity = 0;
        vq.m_weightedVectors.m_p = (vec<6U,_float> *)0x0;
        vq.m_weightedVectors.m_size = 0;
        vq.m_weightedVectors.m_capacity = 0;
        vq.m_node_index_map.m_hash_shift = 0x20;
        vq.m_node_index_map.m_num_valid = 0;
        vq.m_node_index_map.m_grow_threshold = 0;
        vq.m_nodes.m_p = (vq_node *)0x0;
        vq.m_nodes.m_size = 0;
        vq.m_nodes.m_capacity = 0;
        vq.m_codebook.m_p = (vec<6U,_float> *)0x0;
        vq.m_codebook.m_size = 0;
        vq.m_codebook.m_capacity = 0;
        uVar15 = (this->m_params).m_color_endpoint_codebook_size;
        if (this->m_num_tiles < uVar15) {
          uVar15 = this->m_num_tiles;
        }
        tree_clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
                  (&vq,vectors.m_p,weights.m_p,vectors.m_size,uVar15,true,this->m_pTask_pool);
        vector<crnlib::dxt_hc::color_cluster>::resize
                  (&this->m_color_clusters,vq.m_codebook.m_size,false);
        for (uVar15 = 0; ptVar7 = this->m_pTask_pool, uVar15 <= ptVar7->m_num_threads;
            uVar15 = uVar15 + 1) {
          task_pool::
          queue_object_task<crnlib::dxt_hc,void(crnlib::dxt_hc::*)(unsigned_long_long,void*)>
                    (ptVar7,this,0x162774,0,(void *)(ulong)uVar15);
        }
        task_pool::join(ptVar7);
        lVar17 = 0;
        for (uVar20 = 0; uVar12 = (ulong)this->m_num_blocks, uVar20 < uVar12; uVar20 = uVar20 + 1) {
          ptVar5 = (this->m_tiles).m_p;
          if (*(int *)((long)(ptVar5->color_endpoint).m_s + lVar17 + -0xc) != 0) {
            vector<crnlib::color_quad<unsigned_char,_int>_>::append
                      (&(this->m_color_clusters).m_p
                        [*(ushort *)((long)ptVar5->cluster_indices + lVar17)].pixels,
                       (vector<crnlib::color_quad<unsigned_char,_int>_> *)
                       ((long)(ptVar5->color_endpoint).m_s + lVar17 + -0x14));
          }
          lVar17 = lVar17 + 0x48;
        }
        uVar20 = 0;
        while (local_1ac = (uint)uVar20, local_1ac < (uint)uVar12) {
          uVar3 = (this->m_tiles).m_p[(this->m_tile_indices).m_p[uVar20]].cluster_indices[0];
          (this->m_endpoint_indices).m_p[uVar20].field_0.field_0.color = uVar3;
          vector<unsigned_int>::push_back((this->m_color_clusters).m_p[uVar3].blocks,&local_1ac);
          if (this->m_has_subblocks == true) {
            peVar14 = (this->m_endpoint_indices).m_p;
            if ((peVar14[local_1ac].reference != '\0') &&
               (uVar3 == peVar14[local_1ac - 1].field_0.field_0.color)) {
              if (peVar14[local_1ac].reference != '\x01') {
                pacVar8 = this->m_blocks;
                uVar15 = local_1ac >> 1;
                uVar18 = 0;
                for (uVar20 = 0; uVar20 != 0x10; uVar20 = uVar20 + 1) {
                  mirror[uVar20].field_0 =
                       pacVar8[uVar15][(uint)(uVar20 >> 2) & 0x3fffffff | uVar18 & 0xc].field_0;
                  uVar18 = uVar18 + 4;
                }
                *(undefined8 *)(pacVar8[uVar15] + 0xc) = mirror._48_8_;
                *(undefined8 *)(pacVar8[uVar15] + 0xc + 2) = mirror._56_8_;
                *(undefined8 *)(pacVar8[uVar15] + 8) = mirror._32_8_;
                *(undefined8 *)(pacVar8[uVar15] + 8 + 2) = mirror._40_8_;
                *(undefined8 *)(pacVar8[uVar15] + 4) = mirror._16_8_;
                *(undefined8 *)(pacVar8[uVar15] + 4 + 2) = mirror._24_8_;
                *(undefined8 *)pacVar8[uVar15] = mirror._0_8_;
                *(undefined8 *)(pacVar8[uVar15] + 2) = mirror._8_8_;
                peVar14 = (this->m_endpoint_indices).m_p;
              }
              peVar14[local_1ac].reference = '\0';
            }
          }
          uVar12 = (ulong)this->m_num_blocks;
          uVar20 = (ulong)(local_1ac + 1);
        }
        for (uVar15 = 0; ptVar7 = this->m_pTask_pool, uVar15 <= ptVar7->m_num_threads;
            uVar15 = uVar15 + 1) {
          pcVar19 = determine_color_endpoint_codebook_task;
          if (this->m_has_etc_color_blocks != false) {
            pcVar19 = determine_color_endpoint_codebook_task_etc;
          }
          task_pool::
          queue_object_task<crnlib::dxt_hc,void(crnlib::dxt_hc::*)(unsigned_long_long,void*)>
                    (ptVar7,this,(offset_in_dxt_hc_to_subr)pcVar19,0,(void *)(ulong)uVar15);
        }
        task_pool::join(ptVar7);
        tree_clusterizer<crnlib::vec<6U,_float>_>::~tree_clusterizer(&vq);
        vector<unsigned_int>::~vector(&weights);
        vector<crnlib::vec<6U,_float>_>::~vector(&vectors);
        std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::
        ~priority_queue(&queue);
        vector<Node>::~vector((vector<Node> *)&nodes);
        vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::~vector(&endpoints);
        return;
      }
      in_R9 = (_Iter_comp_val<std::less<Node>_> *)(ulong)(uVar15 + endpoints.m_size);
      ppVar21 = endpoints.m_p + (ulong)uVar15 / (ulong)(uVar4 + 1);
      uVar15 = uVar15 + endpoints.m_size;
    } while (ppVar22 == ppVar21);
    if (nodes.m_capacity <= nodes.m_size) {
      in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
      elemental_vector::increase_capacity
                ((elemental_vector *)&nodes,nodes.m_size + 1,true,0x10,vector<Node>::object_mover,
                 false);
    }
    nodes.m_p[nodes.m_size].p = ppVar22;
    nodes.m_p[nodes.m_size].pEnd = ppVar21;
    nodes.m_size = nodes.m_size + 1;
  } while( true );
}

Assistant:

void dxt_hc::determine_color_endpoints()
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        crnlib::vector<std::pair<vec6F, uint>> endpoints;
        for (uint t = 0; t < m_tiles.size(); t++)
        {
            if (m_tiles[t].pixels.size())
            {
                endpoints.push_back(std::make_pair(m_tiles[t].color_endpoint, (uint)(m_tiles[t].pixels.size() * m_tiles[t].weight)));
            }
        }

        struct Node
        {
            std::pair<vec6F, uint>*p, *pEnd;
            Node(std::pair<vec6F, uint>* begin, std::pair<vec6F, uint>* end) :
                p(begin), pEnd(end)
            {
            }
            bool operator<(const Node& other) const
            {
                return *p > *other.p;
            }
            static void sort_task(uint64 data, void* ptr)
            {
                std::sort(((Node*)ptr)->p, ((Node*)ptr)->pEnd);
            }
        };

        crnlib::vector<Node> nodes;
        Node node(0, endpoints.get_ptr());
        for (uint i = 0; i < num_tasks; i++)
        {
            node.p = node.pEnd;
            node.pEnd = endpoints.get_ptr() + endpoints.size() * (i + 1) / num_tasks;
            if (node.p != node.pEnd)
            {
                nodes.push_back(node);
            }
        }

        for (uint i = 0; i < nodes.size(); i++)
        {
            m_pTask_pool->queue_task(&Node::sort_task, i, &nodes[i]);
        }
        m_pTask_pool->join();

        std::priority_queue<Node> queue;
        for (uint i = 0; i < nodes.size(); i++)
        {
            queue.push(nodes[i]);
        }

        crnlib::vector<vec6F> vectors;
        crnlib::vector<uint> weights;
        vectors.reserve(endpoints.size());
        weights.reserve(endpoints.size());
        while (queue.size())
        {
            Node node = queue.top();
            std::pair<vec6F, uint>* endpoint = node.p++;
            queue.pop();
            if(node.p != node.pEnd)
            {
                queue.push(node);
            }
            if (!vectors.size() || endpoint->first != vectors.back())
            {
                vectors.push_back(endpoint->first);
                weights.push_back(endpoint->second);
            }
            else if (weights.back() > UINT_MAX - endpoint->second)
            {
                weights.back() = UINT_MAX;
            }
            else
            {
                weights.back() += endpoint->second;
            }
        }

        tree_clusterizer<vec6F> vq;
        vq.generate_codebook(vectors.get_ptr(), weights.get_ptr(), vectors.size(), math::minimum<uint>(m_num_tiles, m_params.m_color_endpoint_codebook_size), true, m_pTask_pool);
        m_color_clusters.resize(vq.get_codebook_size());

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, &dxt_hc::determine_color_endpoint_clusters_task, i, &vq);
        }
        m_pTask_pool->join();

        for (uint t = 0; t < m_num_blocks; t++)
        {
            if (m_tiles[t].pixels.size())
            {
                m_color_clusters[m_tiles[t].cluster_indices[cColor]].pixels.append(m_tiles[t].pixels);
            }
        }

        for (uint b = 0; b < m_num_blocks; b++)
        {
            uint cluster_index = m_tiles[m_tile_indices[b]].cluster_indices[cColor];
            m_endpoint_indices[b].component[cColor] = cluster_index;
            m_color_clusters[cluster_index].blocks[cColor].push_back(b);
            if (m_has_subblocks && m_endpoint_indices[b].reference && cluster_index == m_endpoint_indices[b - 1].component[cColor])
            {
                if (m_endpoint_indices[b].reference >> 1)
                {
                    color_quad_u8 mirror[16];
                    for (uint p = 0; p < 16; p++)
                    {
                        mirror[p] = m_blocks[b >> 1][(p << 2 & 12) | p >> 2];
                    }
                    memcpy(m_blocks[b >> 1], mirror, 64);
                }
                m_endpoint_indices[b].reference = 0;
            }
        }

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, m_has_etc_color_blocks ? &dxt_hc::determine_color_endpoint_codebook_task_etc : &dxt_hc::determine_color_endpoint_codebook_task, i, nullptr);
        }
        m_pTask_pool->join();
    }